

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

bool __thiscall
Clasp::Cli::ClaspCliConfig::finalizeAppConfig
          (ClaspCliConfig *this,uint8 mode,ParsedOpts *parsed,ProblemType t,bool defs)

{
  undefined1 *puVar1;
  ulong uVar2;
  anon_union_4_2_f967d777_for_HeuParams_9 aVar3;
  OptParams OVar4;
  uint32 uVar5;
  ulong uVar6;
  ulong uVar7;
  ConfigIter CVar8;
  int iVar9;
  ConfigKey config;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SolverParams *solver;
  undefined4 extraout_var_02;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  undefined4 *puVar14;
  SolveParams *pSVar15;
  SolveParams *pSVar16;
  uint uVar17;
  byte bVar19;
  ClaspCliConfig *pCVar20;
  byte bVar21;
  ConfigIter conf;
  string m;
  SolveParams defSearch;
  ulong *puVar10;
  undefined4 extraout_var_01;
  ulong uVar18;
  
  bVar21 = 0;
  pCVar20 = this;
  if ((((mode & 2) == 0) ||
      (pCVar20 = (ClaspCliConfig *)(this->super_ClaspConfig).tester_,
      pCVar20 != (ClaspCliConfig *)0x0)) &&
     (-1 < (char)(pCVar20->super_ClaspConfig).super_BasicSatConfig.super_ContextParams.field_0x8)) {
    iVar9 = (*(pCVar20->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.
              super_Configuration._vptr_Configuration[6])(pCVar20,0);
    puVar10 = (ulong *)CONCAT44(extraout_var,iVar9);
    uVar2 = *puVar10;
    uVar6 = puVar10[1];
    aVar3 = *(anon_union_4_2_f967d777_for_HeuParams_9 *)((long)puVar10 + 0xc);
    OVar4 = *(OptParams *)(puVar10 + 2);
    uVar5 = *(uint32 *)((long)puVar10 + 0x14);
    uVar7 = puVar10[3];
    iVar9 = (*(pCVar20->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.
              super_Configuration._vptr_Configuration[7])(pCVar20,0);
    puVar14 = (undefined4 *)CONCAT44(extraout_var_00,iVar9);
    pSVar15 = &defSearch;
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *(undefined4 *)&(pSVar15->restart).rsSched.super_ScheduleStrategy = *puVar14;
      puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
      pSVar15 = (SolveParams *)((long)pSVar15 + (ulong)bVar21 * -8 + 4);
    }
    bVar19 = (pCVar20->super_ClaspConfig).super_BasicSatConfig.super_ContextParams.cliConfig;
    config = (ConfigKey)bVar19;
    if ((bVar19 == 0) ||
       ((bVar19 == 0x13 &&
        (config = config_many,
        (this->super_ClaspConfig).solve.super_ParallelSolveOptions.algorithm.threads == 1)))) {
      uVar17 = (uint)(uVar2 >> 0x33);
      if ((mode & 2) == 0 && (uVar17 & 1) == 0) {
        if (((this->super_ClaspConfig).solve.super_ParallelSolveOptions.algorithm.threads == 1) ||
           (config = config_many,
           (this->super_ClaspConfig).solve.super_ParallelSolveOptions.algorithm.mode != mode_compete
           )) {
          config = (ConfigKey)(byte)(2 - (t == Asp));
        }
      }
      else {
        config = (ConfigKey)((byte)uVar17 & 1 ^ 0x11);
      }
    }
    if (defs) {
      setAppDefaults(this,config,mode,parsed,t);
    }
    m._M_dataplus._M_p = (pointer)&m.field_2;
    m._M_string_length = 0;
    m.field_2._M_local_buf[0] = '\0';
    conf = getConfig(this,(uint8)config,&m);
    pcVar13 = "config";
    if ((mode & 2) != 0) {
      pcVar13 = "tester";
    }
    uVar17 = 0;
    bVar19 = mode | 4;
    while ((CVar8.base_ = conf.base_, uVar18 = (ulong)uVar17,
           uVar17 != (this->super_ClaspConfig).solve.super_ParallelSolveOptions.algorithm.threads &&
           (*conf.base_ != '\0'))) {
      iVar9 = (*(pCVar20->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.
                super_Configuration._vptr_Configuration[0xb])(pCVar20,uVar18);
      solver = (SolverParams *)CONCAT44(extraout_var_01,iVar9);
      *(int *)&solver->field_0x18 = (int)uVar7;
      *(int *)&solver->heuristic = (int)uVar6;
      (solver->heuristic).field_9 = aVar3;
      solver->opt = OVar4;
      solver->seed = uVar5;
      solver->super_SolverStrategies =
           (SolverStrategies)((uVar18 << 0x3a) + (uVar2 & 0x3ffffffffffffff));
      iVar9 = (*(pCVar20->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.
                super_Configuration._vptr_Configuration[0xc])(pCVar20,uVar18);
      pSVar15 = &defSearch;
      pSVar16 = (SolveParams *)CONCAT44(extraout_var_02,iVar9);
      for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
        *(undefined4 *)&(pSVar16->restart).rsSched.super_ScheduleStrategy =
             *(undefined4 *)&(pSVar15->restart).rsSched.super_ScheduleStrategy;
        pSVar15 = (SolveParams *)((long)pSVar15 + (ulong)bVar21 * -8 + 4);
        pSVar16 = (SolveParams *)((long)pSVar16 + (ulong)bVar21 * -8 + 4);
      }
      setConfig(this,&conf,bVar19,uVar17,parsed,(ParsedOpts *)0x0);
      pcVar11 = Cli::validate(solver,(SolveParams *)CONCAT44(extraout_var_02,iVar9));
      if (pcVar11 != (char *)0x0) {
        Potassco::fail(-2,
                       "bool Clasp::Cli::ClaspCliConfig::finalizeAppConfig(uint8, const ParsedOpts &, ProblemType, bool)"
                       ,0x4a5,"(err = Clasp::Cli::validate(solver, search)) == 0","<%s>.%s : %s",
                       pcVar13,CVar8.base_ + 1,pcVar11,0);
      }
      ConfigIter::next(&conf);
      uVar17 = uVar17 + 1;
      bVar19 = mode | 5;
    }
    puVar1 = &(pCVar20->super_ClaspConfig).super_BasicSatConfig.super_ContextParams.field_0x8;
    *puVar1 = *puVar1 | 0x80;
    std::__cxx11::string::~string((string *)&m);
  }
  return true;
}

Assistant:

bool ClaspCliConfig::finalizeAppConfig(uint8 mode, const ParsedOpts& parsed, ProblemType t, bool defs) {
	UserConfig* config = active(this, mode);
	if (!config || config->hasConfig) { return true; }
	SolverParams defSolver = config->solver(0);
	SolveParams  defSearch = config->search(0);
	uint8 c = config->cliConfig;
	if (c == config_many && solve.numSolver() == 1) { c = config_default; }
	if (c == config_default) {
		if      (defSolver.search == SolverParams::no_learning)       { c = config_nolearn; }
		else if (isTester(mode))                                      { c = config_tester_default; }
		else if (solve.numSolver() == 1 || !solve.defaultPortfolio()) { c = t == Problem_t::Asp ? (uint8)config_asp_default : (uint8)config_sat_default; }
		else                                                          { c = config_many; }
	}
	if (defs && !setAppDefaults(static_cast<ConfigKey>(c), mode, parsed, t)) { return false; }
	std::string m;
	ConfigIter conf = getConfig(c, m);
	mode           |= mode_relaxed;
	const char* ctx = isTester(mode) ? "tester" : "config", *err = 0;
	for (uint32 i = 0; i != solve.numSolver() && conf.valid(); ++i) {
		SolverParams& solver = (config->addSolver(i) = defSolver).setId(i);
		SolveParams&  search = (config->addSearch(i) = defSearch);
		if (!setConfig(conf, mode, i, parsed, 0)) {
			return false;
		}
		POTASSCO_REQUIRE((err = Clasp::Cli::validate(solver, search)) == 0, "<%s>.%s : %s", ctx, conf.name(), err);
		conf.next();
		mode |= mode_solver;
	}
	config->hasConfig = 1;
	return true;
}